

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_signal.cc
# Opt level: O1

void flyd::Signal::SignalHandler(int signo,siginfo_t *siginfo,void *ucontext)

{
  int iVar1;
  char *pcVar2;
  __pid_t v;
  mapped_type *pp_Var3;
  LogStream *pLVar4;
  int *piVar5;
  int iVar6;
  char **ppcVar7;
  byte bVar8;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  SourceFile file_04;
  SourceFile file_05;
  int status;
  int local_1010;
  uint local_100c;
  Logger local_1008;
  
  local_1010 = signo;
  if (muduo::g_logLevel < 3) {
    file._8_8_ = 0xe;
    file.data_ = "flyd_signal.cc";
    muduo::Logger::Logger(&local_1008,file,0x1b);
    if (0xc < (uint)(((int)&local_1008 + 0xfb8) - (int)local_1008.impl_.stream_.buffer_.cur_)) {
      builtin_strncpy(local_1008.impl_.stream_.buffer_.cur_,"来信号了",0xc);
      local_1008.impl_.stream_.buffer_.cur_ = local_1008.impl_.stream_.buffer_.cur_ + 0xc;
    }
    muduo::Logger::~Logger(&local_1008);
  }
  pp_Var3 = std::__detail::
            _Map_base<int,_std::pair<const_int,_void_(*)(int,_siginfo_t_*,_void_*)>,_std::allocator<std::pair<const_int,_void_(*)(int,_siginfo_t_*,_void_*)>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_void_(*)(int,_siginfo_t_*,_void_*)>,_std::allocator<std::pair<const_int,_void_(*)(int,_siginfo_t_*,_void_*)>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&signals_,&local_1010);
  if (*pp_Var3 == (mapped_type)0x0) {
    file_00._8_8_ = 0xe;
    file_00.data_ = "flyd_signal.cc";
    muduo::Logger::Logger(&local_1008,file_00,0x1f,WARN);
    if (0x12 < (uint)(((int)&local_1008 + 0xfb8) - (int)local_1008.impl_.stream_.buffer_.cur_)) {
      builtin_strncpy(local_1008.impl_.stream_.buffer_.cur_,"该信号未注册",0x12);
      local_1008.impl_.stream_.buffer_.cur_ = local_1008.impl_.stream_.buffer_.cur_ + 0x12;
    }
    muduo::Logger::~Logger(&local_1008);
  }
  if ((siginfo == (siginfo_t *)0x0) || ((siginfo->_sifields)._pad[0] == 0)) {
    if (2 < muduo::g_logLevel) goto LAB_0011169c;
    file_02._8_8_ = 0xe;
    file_02.data_ = "flyd_signal.cc";
    muduo::Logger::Logger(&local_1008,file_02,0x36);
    if (10 < (uint)(((int)&local_1008 + 0xfb8) - (int)local_1008.impl_.stream_.buffer_.cur_)) {
      builtin_strncpy(local_1008.impl_.stream_.buffer_.cur_,"signal is ",10);
      local_1008.impl_.stream_.buffer_.cur_ = local_1008.impl_.stream_.buffer_.cur_ + 10;
    }
    muduo::LogStream::operator<<(&local_1008.impl_.stream_,local_1010);
  }
  else {
    if (2 < muduo::g_logLevel) goto LAB_0011169c;
    file_01._8_8_ = 0xe;
    file_01.data_ = "flyd_signal.cc";
    muduo::Logger::Logger(&local_1008,file_01,0x32);
    if (10 < (uint)(((int)&local_1008 + 0xfb8) - (int)local_1008.impl_.stream_.buffer_.cur_)) {
      builtin_strncpy(local_1008.impl_.stream_.buffer_.cur_,"signal is ",10);
      local_1008.impl_.stream_.buffer_.cur_ = local_1008.impl_.stream_.buffer_.cur_ + 10;
    }
    pLVar4 = muduo::LogStream::operator<<(&local_1008.impl_.stream_,local_1010);
    ppcVar7 = &(pLVar4->buffer_).cur_;
    pcVar2 = (pLVar4->buffer_).cur_;
    if (0xc < (uint)((int)ppcVar7 - (int)pcVar2)) {
      builtin_strncpy(pcVar2," ,si_pid is ",0xc);
      *ppcVar7 = *ppcVar7 + 0xc;
    }
    muduo::LogStream::operator<<(pLVar4,(siginfo->_sifields)._pad[0]);
  }
  muduo::Logger::~Logger(&local_1008);
LAB_0011169c:
  if (local_1010 == 0x11) {
    iVar6 = (int)&local_1008 + 0xfb8;
    bVar8 = 0;
LAB_001116bb:
    do {
      v = waitpid(-1,(int *)&local_100c,1);
      if (v != -1) {
        if (v == 0) {
          return;
        }
        bVar8 = 1;
        if ((local_100c & 0x7f) == 0) {
          if (2 < muduo::g_logLevel) goto LAB_001116bb;
          file_04._8_8_ = 0xe;
          file_04.data_ = "flyd_signal.cc";
          muduo::Logger::Logger(&local_1008,file_04,0x78);
          if (6 < (uint)(iVar6 - (int)local_1008.impl_.stream_.buffer_.cur_)) {
            builtin_strncpy(local_1008.impl_.stream_.buffer_.cur_,"pid = ",6);
            local_1008.impl_.stream_.buffer_.cur_ = local_1008.impl_.stream_.buffer_.cur_ + 6;
          }
          pLVar4 = muduo::LogStream::operator<<(&local_1008.impl_.stream_,v);
          ppcVar7 = &(pLVar4->buffer_).cur_;
          pcVar2 = (pLVar4->buffer_).cur_;
          if (0x10 < (uint)((int)ppcVar7 - (int)pcVar2)) {
            builtin_strncpy(pcVar2,"exited with code",0x10);
            *ppcVar7 = *ppcVar7 + 0x10;
          }
          muduo::LogStream::operator<<(pLVar4,local_100c >> 8 & 0xff);
        }
        else {
          if (2 < muduo::g_logLevel) goto LAB_001116bb;
          file_03._8_8_ = 0xe;
          file_03.data_ = "flyd_signal.cc";
          muduo::Logger::Logger(&local_1008,file_03,0x74);
          if (6 < (uint)(iVar6 - (int)local_1008.impl_.stream_.buffer_.cur_)) {
            builtin_strncpy(local_1008.impl_.stream_.buffer_.cur_,"pid = ",6);
            local_1008.impl_.stream_.buffer_.cur_ = local_1008.impl_.stream_.buffer_.cur_ + 6;
          }
          pLVar4 = muduo::LogStream::operator<<(&local_1008.impl_.stream_,v);
          ppcVar7 = &(pLVar4->buffer_).cur_;
          pcVar2 = (pLVar4->buffer_).cur_;
          if (0x12 < (uint)((int)ppcVar7 - (int)pcVar2)) {
            builtin_strncpy(pcVar2," exited on signal ",0x12);
            *ppcVar7 = *ppcVar7 + 0x12;
          }
          muduo::LogStream::operator<<(pLVar4,local_100c & 0x7f);
        }
        muduo::Logger::~Logger(&local_1008);
        goto LAB_001116bb;
      }
      piVar5 = __errno_location();
      iVar1 = *piVar5;
    } while (iVar1 == 4);
    if (!(bool)(bVar8 & iVar1 == 10)) {
      if (iVar1 == 10) {
        iVar6 = 0x69;
      }
      else {
        iVar6 = 0x6c;
      }
      file_05._8_8_ = 0xe;
      file_05.data_ = "flyd_signal.cc";
      muduo::Logger::Logger(&local_1008,file_05,iVar6,ERROR);
      if (0x11 < (uint)(((int)&local_1008 + 0xfb8) - (int)local_1008.impl_.stream_.buffer_.cur_)) {
        builtin_strncpy(local_1008.impl_.stream_.buffer_.cur_,"waitpid() failed!",0x11);
        local_1008.impl_.stream_.buffer_.cur_ = local_1008.impl_.stream_.buffer_.cur_ + 0x11;
      }
      muduo::Logger::~Logger(&local_1008);
    }
  }
  return;
}

Assistant:

void flyd::Signal::SignalHandler(int signo, siginfo_t *siginfo, void *ucontext)
{
    LOG_INFO << "来信号了";
    char            *action; //一个字符串，用于记录一个动作字符串以往日志文件中写
    if(signals_[signo] == NULL)
    {
        LOG_WARN << "该信号未注册";
    }

    action = (char* )" ";//信号的动作

    if(flyd_process == FLYD_MASTER_PROCESS)//MASTER进程，管理进程，信号处理比较多
    {

    }
    else if(flyd_process == FLYD_WORK_PROCESS)//WORK进程，具体干活的进程，处理信号比较少
    {

    }
    else{//未定义的其他进程，暂时什么都不干

    }

    if(siginfo && siginfo->si_pid)
    {
        LOG_INFO << "signal is " << signo << " ,si_pid is " << siginfo->si_pid;
    }
    else
    {
        LOG_INFO << "signal is " << signo ;
    }


    //子进程状态有变化，通常是意外退出【既然官方是在这里处理，我们也学习官方在这里处理】
    if (signo == SIGCHLD)
    {
        flyd_process_get_status(); //获取子进程的结束状态
    } //end if


}